

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O2

HTS_Boolean HTS_Engine_load(HTS_Engine *engine,char **voices,size_t num_voices)

{
  HTS_ModelSet *ms;
  HTS_Boolean HVar1;
  int iVar2;
  size_t num;
  size_t sVar3;
  double *pdVar4;
  char *pcVar5;
  char *pcVar6;
  double **ppdVar7;
  size_t sVar8;
  double dVar9;
  undefined1 auVar10 [16];
  
  HTS_Engine_clear(engine);
  ms = &engine->ms;
  HVar1 = HTS_ModelSet_load(ms,voices,num_voices);
  if (HVar1 == '\x01') {
    num = HTS_ModelSet_get_nstream(ms);
    auVar10._8_4_ = (int)(num_voices >> 0x20);
    auVar10._0_8_ = num_voices;
    auVar10._12_4_ = 0x45300000;
    sVar3 = HTS_ModelSet_get_sampling_frequency(ms);
    (engine->condition).sampling_frequency = sVar3;
    sVar3 = HTS_ModelSet_get_fperiod(ms);
    (engine->condition).fperiod = sVar3;
    pdVar4 = (double *)HTS_calloc(num,8);
    (engine->condition).msd_threshold = pdVar4;
    for (sVar3 = 0; num != sVar3; sVar3 = sVar3 + 1) {
      pdVar4[sVar3] = 0.5;
    }
    pdVar4 = (double *)HTS_calloc(num,8);
    (engine->condition).gv_weight = pdVar4;
    for (sVar3 = 0; num != sVar3; sVar3 = sVar3 + 1) {
      pdVar4[sVar3] = 1.0;
    }
    pcVar5 = HTS_ModelSet_get_option(ms,0);
    pcVar6 = strstr(pcVar5,"GAMMA=");
    if (pcVar6 != (char *)0x0) {
      iVar2 = atoi(pcVar6 + 6);
      (engine->condition).stage = (long)iVar2;
    }
    pcVar6 = strstr(pcVar5,"LN_GAIN=");
    if (pcVar6 != (char *)0x0) {
      iVar2 = atoi(pcVar6 + 8);
      (engine->condition).use_log_gain = iVar2 == 1;
    }
    pcVar5 = strstr(pcVar5,"ALPHA=");
    if (pcVar5 != (char *)0x0) {
      dVar9 = atof(pcVar5 + 6);
      (engine->condition).alpha = dVar9;
    }
    dVar9 = 1.0 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)num_voices) - 4503599627370496.0));
    pdVar4 = (double *)HTS_calloc(num_voices,8);
    (engine->condition).duration_iw = pdVar4;
    for (sVar3 = 0; num_voices != sVar3; sVar3 = sVar3 + 1) {
      pdVar4[sVar3] = dVar9;
    }
    ppdVar7 = (double **)HTS_calloc(num_voices,8);
    (engine->condition).parameter_iw = ppdVar7;
    for (sVar3 = 0; sVar3 != num_voices; sVar3 = sVar3 + 1) {
      pdVar4 = (double *)HTS_calloc(num,8);
      (engine->condition).parameter_iw[sVar3] = pdVar4;
      for (sVar8 = 0; num != sVar8; sVar8 = sVar8 + 1) {
        (engine->condition).parameter_iw[sVar3][sVar8] = dVar9;
      }
    }
    ppdVar7 = (double **)HTS_calloc(num_voices,8);
    (engine->condition).gv_iw = ppdVar7;
    for (sVar3 = 0; sVar3 != num_voices; sVar3 = sVar3 + 1) {
      pdVar4 = (double *)HTS_calloc(num,8);
      (engine->condition).gv_iw[sVar3] = pdVar4;
      for (sVar8 = 0; num != sVar8; sVar8 = sVar8 + 1) {
        (engine->condition).gv_iw[sVar3][sVar8] = dVar9;
      }
    }
    HVar1 = '\x01';
  }
  else {
    HTS_Engine_clear(engine);
    HVar1 = '\0';
  }
  return HVar1;
}

Assistant:

HTS_Boolean HTS_Engine_load(HTS_Engine * engine, char **voices, size_t num_voices)
{
   size_t i, j;
   size_t nstream;
   double average_weight;
   const char *option, *find;

   /* reset engine */
   HTS_Engine_clear(engine);

   /* load voices */
   if (HTS_ModelSet_load(&engine->ms, voices, num_voices) != TRUE) {
      HTS_Engine_clear(engine);
      return FALSE;
   }
   nstream = HTS_ModelSet_get_nstream(&engine->ms);
   average_weight = 1.0 / num_voices;

   /* global */
   engine->condition.sampling_frequency = HTS_ModelSet_get_sampling_frequency(&engine->ms);
   engine->condition.fperiod = HTS_ModelSet_get_fperiod(&engine->ms);
   engine->condition.msd_threshold = (double *) HTS_calloc(nstream, sizeof(double));
   for (i = 0; i < nstream; i++)
      engine->condition.msd_threshold[i] = 0.5;
   engine->condition.gv_weight = (double *) HTS_calloc(nstream, sizeof(double));
   for (i = 0; i < nstream; i++)
      engine->condition.gv_weight[i] = 1.0;

   /* spectrum */
   option = HTS_ModelSet_get_option(&engine->ms, 0);
   find = strstr(option, "GAMMA=");
   if (find != NULL)
      engine->condition.stage = (size_t) atoi(&find[strlen("GAMMA=")]);
   find = strstr(option, "LN_GAIN=");
   if (find != NULL)
      engine->condition.use_log_gain = atoi(&find[strlen("LN_GAIN=")]) == 1 ? TRUE : FALSE;
   find = strstr(option, "ALPHA=");
   if (find != NULL)
      engine->condition.alpha = atof(&find[strlen("ALPHA=")]);

   /* interpolation weights */
   engine->condition.duration_iw = (double *) HTS_calloc(num_voices, sizeof(double));
   for (i = 0; i < num_voices; i++)
      engine->condition.duration_iw[i] = average_weight;
   engine->condition.parameter_iw = (double **) HTS_calloc(num_voices, sizeof(double *));
   for (i = 0; i < num_voices; i++) {
      engine->condition.parameter_iw[i] = (double *) HTS_calloc(nstream, sizeof(double));
      for (j = 0; j < nstream; j++)
         engine->condition.parameter_iw[i][j] = average_weight;
   }
   engine->condition.gv_iw = (double **) HTS_calloc(num_voices, sizeof(double *));
   for (i = 0; i < num_voices; i++) {
      engine->condition.gv_iw[i] = (double *) HTS_calloc(nstream, sizeof(double));
      for (j = 0; j < nstream; j++)
         engine->condition.gv_iw[i][j] = average_weight;
   }

   return TRUE;
}